

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResupplyOfferPdu.cpp
# Opt level: O2

void __thiscall DIS::ResupplyOfferPdu::ResupplyOfferPdu(ResupplyOfferPdu *this)

{
  LogisticsFamilyPdu::LogisticsFamilyPdu(&this->super_LogisticsFamilyPdu);
  (this->super_LogisticsFamilyPdu).super_Pdu.super_PduSuperclass._vptr_PduSuperclass =
       (_func_int **)&PTR__ResupplyOfferPdu_001c2d00;
  EntityID::EntityID(&this->_receivingEntityID);
  EntityID::EntityID(&this->_supplyingEntityID);
  this->_numberOfSupplyTypes = '\0';
  this->_padding1 = '\0';
  this->_padding2 = 0;
  (this->_supplies).super__Vector_base<DIS::SupplyQuantity,_std::allocator<DIS::SupplyQuantity>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_supplies).super__Vector_base<DIS::SupplyQuantity,_std::allocator<DIS::SupplyQuantity>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_supplies).super__Vector_base<DIS::SupplyQuantity,_std::allocator<DIS::SupplyQuantity>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  PduSuperclass::setPduType((PduSuperclass *)this,'\x06');
  return;
}

Assistant:

ResupplyOfferPdu::ResupplyOfferPdu() : LogisticsFamilyPdu(),
   _receivingEntityID(), 
   _supplyingEntityID(), 
   _numberOfSupplyTypes(0), 
   _padding1(0), 
   _padding2(0)
{
    setPduType( 6 );
}